

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

DdNode * Extra_bddSpaceEquationsPos(DdManager *dd,DdNode *bSpace)

{
  DdNode *pDVar1;
  DdNode *zRes;
  DdNode *bSpace_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraBddSpaceEquationsPos(dd,bSpace);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_bddSpaceEquationsPos( DdManager * dd, DdNode * bSpace )
{
    DdNode * zRes;
    do {
        dd->reordered = 0;
        zRes = extraBddSpaceEquationsPos( dd, bSpace );
    } while (dd->reordered == 1);
    return zRes;
}